

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Forel.cpp
# Opt level: O3

void __thiscall Forel::print_clusters(Forel *this,ofstream *out,string *filename)

{
  pointer *ppdVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  pointer pCVar9;
  pointer pPVar10;
  int iVar11;
  long *plVar12;
  size_type *psVar13;
  pointer pPVar14;
  double *pdVar15;
  long lVar16;
  pointer pCVar17;
  long lVar18;
  Cluster g;
  vector<double,_std::allocator<double>_> values;
  string filename_forel;
  string filename_gnu;
  Point p;
  string arrow_name;
  ofstream out_gnu;
  ofstream out_arrow;
  ofstream out_forel;
  undefined1 local_730 [24];
  long lStack_718;
  ofstream *local_710;
  vector<double,_std::allocator<double>_> local_708;
  undefined8 uStack_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  long *local_6c8;
  long local_6c0;
  long local_6b8;
  long lStack_6b0;
  Forel *local_6a8;
  double local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  long *local_678;
  long local_670;
  long local_668;
  long lStack_660;
  long local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  long local_630;
  filebuf local_628 [240];
  ios_base aiStack_538 [264];
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_710 = out;
  std::ofstream::ofstream(&local_630);
  std::ofstream::ofstream(&local_430);
  std::ofstream::ofstream(&local_230);
  cVar3 = (char)filename;
  std::__cxx11::string::rfind(cVar3,0x2e);
  std::__cxx11::string::substr((ulong)&local_6c8,(ulong)filename);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_6c8);
  local_678 = &local_668;
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_668 = *plVar12;
    lStack_660 = plVar6[3];
  }
  else {
    local_668 = *plVar12;
    local_678 = (long *)*plVar6;
  }
  local_670 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8,local_6b8 + 1);
  }
  std::__cxx11::string::rfind(cVar3,0x2e);
  std::__cxx11::string::substr((ulong)&local_6e8,(ulong)filename);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_6e8);
  local_6c8 = &local_6b8;
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_6b8 = *plVar12;
    lStack_6b0 = plVar6[3];
  }
  else {
    local_6b8 = *plVar12;
    local_6c8 = (long *)*plVar6;
  }
  local_6c0 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::rfind(cVar3,0x2e);
  std::__cxx11::string::substr((ulong)local_730,(ulong)filename);
  plVar6 = (long *)std::__cxx11::string::append(local_730);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_6e8.field_2._M_allocated_capacity = *psVar13;
    local_6e8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_6e8.field_2._M_allocated_capacity = *psVar13;
    local_6e8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_6e8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pPVar10 = (pointer)(local_730 + 0x10);
  if ((pointer)local_730._0_8_ != pPVar10) {
    operator_delete((void *)local_730._0_8_,(ulong)((long)(double *)local_730._16_8_ + 1));
  }
  std::ofstream::open((string *)&local_630,(_Ios_Openmode)&local_6c8);
  std::ofstream::open((string *)&local_430,(_Ios_Openmode)&local_678);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_6e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_630,"rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)",0x33);
  std::ios::widen((char)(ostream *)&local_630 + (char)*(undefined8 *)(local_630 + -0x18));
  std::ostream::put((char)&local_630);
  std::ostream::flush();
  std::operator+(&local_698,"plot \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",filename);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_698);
  pPVar14 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pPVar14) {
    local_730._16_8_ = pPVar14->eps;
    lStack_718 = plVar6[3];
    local_730._0_8_ = pPVar10;
  }
  else {
    local_730._16_8_ = pPVar14->eps;
    local_730._0_8_ = (pointer)*plVar6;
  }
  local_730._8_8_ = plVar6[1];
  *plVar6 = (long)pPVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_630,(char *)local_730._0_8_,local_730._8_8_);
  std::operator+(&local_650," \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",&local_6e8);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_650);
  ppdVar1 = &local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pdVar15 = (double *)(puVar8 + 2);
  if ((pointer *)*puVar8 == (pointer *)pdVar15) {
    local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*pdVar15;
    uStack_6f0 = puVar8[3];
    local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppdVar1;
  }
  else {
    local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*pdVar15;
    local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar8;
  }
  local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar8[1];
  *puVar8 = pdVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(char *)local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
             (long)local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish);
  if ((pointer *)
      local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != ppdVar1) {
    operator_delete(local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_730._0_8_ != pPVar10) {
    operator_delete((void *)local_730._0_8_,(ulong)((long)(double *)local_730._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::open((string *)local_710,(_Ios_Openmode)filename);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Errors in opening",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  else {
    pCVar17 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar9 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_6a8 = this;
    if (0 < (int)((ulong)((long)pCVar9 - (long)pCVar17) >> 3) * -0x55555555) {
      lVar18 = 0;
      lVar16 = 0;
      do {
        if (10 < (ulong)((*(long *)((long)&(pCVar17->points).
                                           super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                   + lVar18 + 8) -
                          *(long *)((long)&(pCVar17->points).
                                           super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                   + lVar18) >> 3) * -0x5555555555555555)) {
          std::vector<Point,_std::allocator<Point>_>::vector
                    ((vector<Point,_std::allocator<Point>_> *)local_730,
                     (vector<Point,_std::allocator<Point>_> *)
                     ((long)&(pCVar17->points).super__Vector_base<Point,_std::allocator<Point>_>.
                             _M_impl + lVar18));
          Cluster::find_mass_centre((Point *)&local_698,(Cluster *)local_730);
          Cluster::find_vectors(&local_708,(Cluster *)local_730);
          poVar7 = std::ostream::_M_insert<double>((double)local_698._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<double>((double)local_698.field_2._M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<double>
                             ((double)*local_708.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<double>
                             (local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[1]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          poVar7 = std::ostream::_M_insert<double>((double)local_698._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<double>((double)local_698.field_2._M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<double>
                             (local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<double>
                             (local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[3]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((pointer *)
              local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_708.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_708.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_708.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_730._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_730._0_8_,local_730._16_8_ - local_730._0_8_);
          }
          pCVar17 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar9 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        lVar16 = lVar16 + 1;
        iVar11 = (int)((long)pCVar9 - (long)pCVar17 >> 3) * -0x55555555;
        lVar18 = lVar18 + 0x18;
      } while (lVar16 < iVar11);
      if (0 < iVar11) {
        lVar16 = 0;
        do {
          iVar11 = rand();
          iVar4 = rand();
          iVar5 = rand();
          std::vector<Point,_std::allocator<Point>_>::vector
                    ((vector<Point,_std::allocator<Point>_> *)local_730,
                     &(this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl
                      .super__Vector_impl_data._M_start[lVar16].points);
          local_658 = lVar16;
          if (0 < (int)((ulong)(local_730._8_8_ - local_730._0_8_) >> 3) * -0x55555555) {
            local_6a0 = (double)(ulong)(uint)(iVar11 % 0x101);
            lVar16 = 0;
            lVar18 = 0;
            do {
              poVar7 = std::ostream::_M_insert<double>
                                 (*(double *)((long)(local_730._0_8_ + 8) + lVar16));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::ostream::_M_insert<double>
                                 (*(double *)((long)(local_730._0_8_ + 0x10) + lVar16));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,SUB84(local_6a0,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4 % 0x101);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5 % 0x101);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              lVar18 = lVar18 + 1;
              lVar16 = lVar16 + 0x18;
            } while (lVar18 < (int)((ulong)(local_730._8_8_ - local_730._0_8_) >> 3) * -0x55555555);
          }
          if ((pointer)local_730._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_730._0_8_,local_730._16_8_ - local_730._0_8_);
          }
          lVar16 = local_658 + 1;
          this = local_6a8;
        } while (lVar16 < (int)((ulong)((long)(local_6a8->clusters).
                                              super__Vector_base<Cluster,_std::allocator<Cluster>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_6a8->clusters).
                                             super__Vector_base<Cluster,_std::allocator<Cluster>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
    }
    pPVar10 = (this->forel_circles).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->forel_circles).
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pPVar10) >> 3) *
            -0x55555555) {
      lVar16 = 0x10;
      lVar18 = 0;
      do {
        local_6a0 = *(double *)((long)&pPVar10->eps + lVar16);
        poVar7 = std::ostream::_M_insert<double>(*(double *)((long)pPVar10 + lVar16 + -8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        poVar7 = std::ostream::_M_insert<double>(local_6a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        poVar7 = std::ostream::_M_insert<double>(local_6a8->forel_r);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        lVar18 = lVar18 + 1;
        pPVar10 = (local_6a8->forel_circles).super__Vector_base<Point,_std::allocator<Point>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 0x18;
      } while (lVar18 < (int)((ulong)((long)(local_6a8->forel_circles).
                                            super__Vector_base<Point,_std::allocator<Point>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)pPVar10) >> 3) * -0x55555555);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8,local_6b8 + 1);
  }
  if (local_678 != &local_668) {
    operator_delete(local_678,local_668 + 1);
  }
  uVar2 = _memcpy;
  lVar16 = _VTT;
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  local_430 = lVar16;
  *(undefined8 *)(local_428 + *(long *)(lVar16 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_630 = lVar16;
  *(undefined8 *)(local_628 + *(long *)(lVar16 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_628);
  std::ios_base::~ios_base(aiStack_538);
  return;
}

Assistant:

void Forel::print_clusters(ofstream &out,string filename) {
    ofstream out_gnu;
    ofstream out_arrow;
    ofstream out_forel;
    string arrow_name=filename.substr(0, filename.find_last_of('.')) + "_arrow";
    string filename_gnu = filename.substr(0, filename.find_last_of('.')) + "_gnu.plt";
    string filename_forel = filename.substr(0, filename.find_last_of('.')) + "circle_centres";
    out_gnu.open(filename_gnu);
    out_arrow.open(arrow_name);
    out_forel.open(filename_forel);
    out_gnu << "rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)" << endl;

    out_gnu << "plot '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename +
               "' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable," <<
            " '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename_forel + "' with circles";

    out.open(filename);
    //log("printing clusters to " + filename);


    int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) clusters.size(); i++) {
            if (clusters[i].points.size() > 10) {

                Cluster g = clusters[i];
                Point p = g.find_mass_centre();
                vector<double> values = g.find_vectors();
                out_arrow << p.x << " " << p.y << " " << values[0] << " " << values[1] << endl;
                out_arrow << p.x << " " << p.y << " " << values[2] << " " << values[3] << endl;

            }
        }

        for (int i = 0; i < (int) clusters.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Cluster g = clusters[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c << " " << endl;
            }


        }
        {

            for (int i = 0; i < (int) forel_circles.size(); i++) {
                Point g = forel_circles[i];
                out_forel << g.x << " " << g.y << " " << forel_r << endl;
            }


        }
        out.close();
        out_arrow.close();
        out_gnu.close();
        out_forel.close();
    }

}